

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::rust::RustGenerator::ForAllUnionObjectVariantsBesidesNone
          (RustGenerator *this,EnumDef *enum_def,function<void_()> *cb)

{
  CodeWriter *this_00;
  IdlNamer *this_01;
  int *piVar1;
  int iVar2;
  EnumVal *v;
  RustGenerator *pRVar3;
  pointer ppEVar4;
  allocator<char> local_89;
  RustGenerator *local_88;
  function<void_()> *local_80;
  EnumDef *local_78;
  string local_70;
  string local_50;
  
  this_00 = &this->code_;
  this_01 = &this->namer_;
  local_88 = this;
  local_80 = cb;
  local_78 = enum_def;
  for (ppEVar4 = (enum_def->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar4 !=
      (local_78->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar4 = ppEVar4 + 1) {
    v = *ppEVar4;
    if ((v->union_type).base_type != BASE_TYPE_NONE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"VARIANT_NAME",&local_89);
      (*(this_01->super_Namer)._vptr_Namer[0x13])(&local_70,this_01,v);
      CodeWriter::SetValue(this_00,&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"NATIVE_VARIANT",&local_89);
      IdlNamer::LegacyRustNativeVariant_abi_cxx11_(&local_70,this_01,v);
      CodeWriter::SetValue(this_00,&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"U_ELEMENT_NAME",&local_89);
      (*(this_01->super_Namer)._vptr_Namer[4])(&local_70,this_01,v);
      CodeWriter::SetValue(this_00,&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"U_ELEMENT_TABLE_TYPE",&local_89);
      NamespacedNativeName_abi_cxx11_(&local_70,local_88,(v->union_type).struct_def);
      CodeWriter::SetValue(this_00,&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      pRVar3 = local_88;
      piVar1 = &(local_88->code_).cur_ident_lvl_;
      *piVar1 = *piVar1 + 1;
      std::function<void_()>::operator()(local_80);
      iVar2 = (pRVar3->code_).cur_ident_lvl_;
      if (iVar2 != 0) {
        (local_88->code_).cur_ident_lvl_ = iVar2 + -1;
      }
    }
  }
  return;
}

Assistant:

void ForAllUnionObjectVariantsBesidesNone(const EnumDef &enum_def,
                                            std::function<void()> cb) {
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &enum_val = **it;
      if (enum_val.union_type.base_type == BASE_TYPE_NONE) continue;
      code_.SetValue("VARIANT_NAME", namer_.Variant(enum_val));
      // For legacy reasons, enum variants are Keep case while enum native
      // variants are UpperCamel case.
      code_.SetValue("NATIVE_VARIANT",
                     namer_.LegacyRustNativeVariant(enum_val));
      code_.SetValue("U_ELEMENT_NAME", namer_.Method(enum_val));
      code_.SetValue("U_ELEMENT_TABLE_TYPE",
                     NamespacedNativeName(*enum_val.union_type.struct_def));
      code_.IncrementIdentLevel();
      cb();
      code_.DecrementIdentLevel();
    }
  }